

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRasterizer.cpp
# Opt level: O1

void __thiscall
rr::TriangleRasterizer::TriangleRasterizer
          (TriangleRasterizer *this,IVec4 *viewport,int numSamples,RasterizationState *state)

{
  int i;
  long lVar1;
  
  lVar1 = 0;
  do {
    (this->m_viewport).m_data[lVar1] = viewport->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  this->m_numSamples = numSamples;
  this->m_winding = state->winding;
  this->m_horizontalFill = state->horizontalFill;
  this->m_verticalFill = state->verticalFill;
  (this->m_edge12).a = 0;
  (this->m_edge12).b = 0;
  *(undefined8 *)((long)&(this->m_edge12).b + 1) = 0;
  *(undefined8 *)((long)&(this->m_edge12).c + 1) = 0;
  (this->m_edge20).a = 0;
  (this->m_edge20).b = 0;
  *(undefined8 *)((long)&(this->m_edge20).b + 1) = 0;
  *(undefined8 *)((long)&(this->m_edge20).c + 1) = 0;
  (this->m_v0).m_data[0] = 0.0;
  (this->m_v0).m_data[1] = 0.0;
  (this->m_v0).m_data[2] = 0.0;
  (this->m_v0).m_data[3] = 0.0;
  (this->m_v1).m_data[0] = 0.0;
  (this->m_v1).m_data[1] = 0.0;
  (this->m_v1).m_data[2] = 0.0;
  (this->m_v1).m_data[3] = 0.0;
  (this->m_v2).m_data[0] = 0.0;
  (this->m_v2).m_data[1] = 0.0;
  (this->m_v2).m_data[2] = 0.0;
  (this->m_v2).m_data[3] = 0.0;
  (this->m_edge01).a = 0;
  (this->m_edge01).b = 0;
  *(undefined8 *)((long)&(this->m_edge01).b + 1) = 0;
  *(undefined8 *)((long)&(this->m_edge01).c + 1) = 0;
  this->m_face = FACETYPE_LAST;
  *(undefined8 *)(this->m_bboxMin).m_data = 0;
  *(undefined8 *)(this->m_bboxMax).m_data = 0;
  *(undefined8 *)(this->m_curPos).m_data = 0;
  this->m_viewportOrientation = state->viewportOrientation;
  return;
}

Assistant:

TriangleRasterizer::TriangleRasterizer (const tcu::IVec4& viewport, const int numSamples, const RasterizationState& state)
	: m_viewport				(viewport)
	, m_numSamples				(numSamples)
	, m_winding					(state.winding)
	, m_horizontalFill			(state.horizontalFill)
	, m_verticalFill			(state.verticalFill)
	, m_face					(FACETYPE_LAST)
	, m_viewportOrientation		(state.viewportOrientation)
{
}